

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

uchar * __thiscall CNetChunkHeader::Unpack(CNetChunkHeader *this,uchar *pData)

{
  byte bVar1;
  long lVar2;
  
  bVar1 = *pData;
  this->m_Flags = (uint)(bVar1 >> 6);
  this->m_Size = pData[1] & 0x3f | (*pData & 0x3f) << 6;
  this->m_Sequence = -1;
  lVar2 = 2;
  if ((bVar1 >> 6 & 1) != 0) {
    this->m_Sequence = (uint)pData[2] + (pData[1] & 0xffffffc0) * 4;
    lVar2 = 3;
  }
  return pData + lVar2;
}

Assistant:

unsigned char *CNetChunkHeader::Unpack(unsigned char *pData)
{
	m_Flags = (pData[0]>>6)&0x03;
	m_Size = ((pData[0]&0x3F)<<6) | (pData[1]&0x3F);
	m_Sequence = -1;
	if(m_Flags&NET_CHUNKFLAG_VITAL)
	{
		m_Sequence = ((pData[1]&0xC0)<<2) | pData[2];
		return pData + 3;
	}
	return pData + 2;
}